

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,true>>,mjs::gc_heap&,unsigned_int&>
          (gc_heap *this,size_t num_bytes,gc_heap *args,uint *args_1)

{
  slot_allocation_header *psVar1;
  char *pcVar2;
  undefined8 extraout_RDX;
  slot *in_R8;
  allocation_result aVar3;
  gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_> gVar4;
  undefined1 local_40 [8];
  allocation_result a;
  uint *args_local_1;
  gc_heap *args_local;
  size_t num_bytes_local;
  gc_heap *this_local;
  
  a.obj = in_R8;
  aVar3 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  a._0_8_ = aVar3.obj;
  local_40._0_4_ = aVar3.pos;
  psVar1 = allocation_result::hdr((allocation_result *)local_40);
  if (psVar1->type == 0xffffffff) {
    pcVar2 = (char *)a._0_8_;
    gc_type_info_registration<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,true>>>::
    construct<mjs::gc_heap&,unsigned_int&>
              ((void *)a._0_8_,(gc_heap *)args_1,(uint *)&(a.obj)->representation);
    pcVar2 = gc_type_info_registration<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_>
             ::index(pcVar2,(int)args_1);
    psVar1 = allocation_result::hdr((allocation_result *)local_40);
    psVar1->type = (uint32_t)pcVar2;
    gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_>::gc_heap_ptr
              ((gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_> *)
               this,(gc_heap *)num_bytes,local_40._0_4_);
    gVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar4.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_>)
           gVar4.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string>>, Args = <mjs::gc_heap &, unsigned int &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}